

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper *clipper,int item_n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiOldColumns *pIVar5;
  ImGuiTable *table;
  float fVar6;
  ImGuiContext *pIVar7;
  uint uVar8;
  float fVar9;
  
  pIVar7 = GImGui;
  fVar1 = clipper->ItemsHeight;
  fVar6 = fVar1 * (float)(item_n - *(int *)((long)clipper->TempData + 0x10)) +
          *(float *)((long)clipper->TempData + 8) + clipper->StartPosY;
  pIVar4 = GImGui->CurrentWindow;
  fVar2 = (pIVar4->DC).CursorPos.y;
  (pIVar4->DC).CursorPos.y = fVar6;
  fVar3 = (pIVar4->DC).CursorMaxPos.y;
  fVar9 = fVar6 - (pIVar7->Style).ItemSpacing.y;
  uVar8 = -(uint)(fVar9 <= fVar3);
  (pIVar4->DC).CursorMaxPos.y = (float)(uVar8 & (uint)fVar3 | ~uVar8 & (uint)fVar9);
  (pIVar4->DC).CursorPosPrevLine.y = fVar6 - fVar1;
  (pIVar4->DC).PrevLineSize.y = fVar1 - (pIVar7->Style).ItemSpacing.y;
  pIVar5 = (pIVar4->DC).CurrentColumns;
  if (pIVar5 != (ImGuiOldColumns *)0x0) {
    pIVar5->LineMinY = fVar6;
  }
  table = pIVar7->CurrentTable;
  if (table != (ImGuiTable *)0x0) {
    if (table->IsInsideRow == true) {
      ImGui::TableEndRow(table);
    }
    table->RowPosY2 = (pIVar4->DC).CursorPos.y;
    table->RowBgColorCounter = table->RowBgColorCounter + (int)((fVar6 - fVar2) / fVar1 + 0.5);
  }
  return;
}

Assistant:

static void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper* clipper, int item_n)
{
    // StartPosY starts from ItemsFrozen hence the subtraction
    // Perform the add and multiply with double to allow seeking through larger ranges
    ImGuiListClipperData* data = (ImGuiListClipperData*)clipper->TempData;
    float pos_y = (float)((double)clipper->StartPosY + data->LossynessOffset + (double)(item_n - data->ItemsFrozen) * clipper->ItemsHeight);
    ImGuiListClipper_SeekCursorAndSetupPrevLine(pos_y, clipper->ItemsHeight);
}